

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O1

CTcMakeModule * __thiscall
CTcMake::add_module(CTcMake *this,char *src_name,char *sym_name,char *obj_name,int first)

{
  CTcMakeModule *this_00;
  CTcMakeModule *pCVar1;
  
  this_00 = (CTcMakeModule *)operator_new(0x68);
  this_00->nxt_ = (CTcMakeModule *)0x0;
  (this_00->src_).buf_ = (textchar_t *)0x0;
  (this_00->search_src_).buf_ = (textchar_t *)0x0;
  (this_00->orig_name_).buf_ = (textchar_t *)0x0;
  (this_00->sym_).buf_ = (textchar_t *)0x0;
  (this_00->obj_).buf_ = (textchar_t *)0x0;
  *(undefined8 *)((long)&(this_00->obj_).buf_ + 4) = 0;
  this_00->needs_obj_recompile_ = 0;
  this_00->exclude_ = 0;
  (this_00->url_).buf_ = (textchar_t *)0x0;
  (this_00->lib_name_).buf_ = (textchar_t *)0x0;
  (this_00->lib_url_).buf_ = (textchar_t *)0x0;
  this_00->source_type_ = TCMOD_SOURCE_NORMAL;
  this_00->seqno_ = 0;
  CTcMakeModule::set_module_name(this_00,src_name);
  if (sym_name != (char *)0x0) {
    CTcMakeStr::set(&this_00->sym_,sym_name);
  }
  if (obj_name != (char *)0x0) {
    CTcMakeStr::set(&this_00->obj_,obj_name);
  }
  if (first == 0) {
    pCVar1 = (CTcMakeModule *)&this->mod_head_;
    if (this->mod_tail_ != (CTcMakeModule *)0x0) {
      pCVar1 = this->mod_tail_;
    }
    pCVar1->nxt_ = this_00;
    this->mod_tail_ = this_00;
    this_00->nxt_ = (CTcMakeModule *)0x0;
  }
  else {
    this_00->nxt_ = this->mod_head_;
    this->mod_head_ = this_00;
    if (this->mod_tail_ == (CTcMakeModule *)0x0) {
      this->mod_tail_ = this_00;
    }
  }
  return this_00;
}

Assistant:

CTcMakeModule *CTcMake::add_module(const char *src_name,
                                   const char *sym_name,
                                   const char *obj_name,
                                   int first)
{
    /* create a module object */
    CTcMakeModule *mod = new CTcMakeModule();

    /* set the module name */
    mod->set_module_name(src_name);

    /* set the symbol file name if specified */
    if (sym_name != 0)
        mod->set_symbol_name(sym_name);

    /* set the object file name if specified */
    if (obj_name != 0)
        mod->set_object_name(obj_name);

    /* add it to the module list */
    if (first)
        add_module_first(mod);
    else
        add_module(mod);

    /* return the new module */
    return mod;
}